

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O2

vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> * __thiscall
tinyusdz::lerp<std::array<float,4ul>>
          (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
           *__return_storage_ptr__,tinyusdz *this,
          vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *a,
          vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *b,double t)

{
  ulong uVar1;
  ulong __new_size;
  long lVar2;
  bool bVar3;
  float4 fVar4;
  
  (__return_storage_ptr__->
  super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar1 = *(long *)(this + 8) - *(long *)this >> 4;
  __new_size = (long)(a->
                     super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(a->
                     super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 4;
  if (uVar1 <= __new_size) {
    __new_size = uVar1;
  }
  if (__new_size != 0) {
    std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::resize
              (__return_storage_ptr__,__new_size);
    if (*(long *)(this + 8) - *(long *)this ==
        (long)(a->
              super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(a->
              super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>).
              _M_impl.super__Vector_impl_data._M_start) {
      lVar2 = 0;
      while (bVar3 = __new_size != 0, __new_size = __new_size - 1, bVar3) {
        fVar4 = lerp<std::array<float,4ul>>
                          ((float4 *)(*(long *)this + lVar2),
                           (float4 *)
                           ((long)((a->
                                   super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar2),t)
        ;
        *(_Type *)((long)((__return_storage_ptr__->
                          super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar2) =
             fVar4._M_elems;
        lVar2 = lVar2 + 0x10;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> lerp(const std::vector<T> &a, const std::vector<T> &b,
                           const double t) {
  std::vector<T> dst;

  // Choose shorter one
  size_t n = std::min(a.size(), b.size());
  if (n == 0) {
    return dst;
  }

  dst.resize(n);

  if (a.size() != b.size()) {
    return dst;
  }
  for (size_t i = 0; i < n; i++) {
    dst[i] = lerp(a[i], b[i], t);
  }

  return dst;
}